

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manager.hpp
# Opt level: O1

void __thiscall manager::Manager<uttt::IBoard>::~Manager(Manager<uttt::IBoard> *this)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  
  for (p_Var2 = (this->bots)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
      p_Var2 = p_Var2->_M_nxt) {
    p_Var1 = p_Var2[2]._M_nxt;
    if (p_Var1 != (_Hash_node_base *)0x0) {
      if (p_Var1[1]._M_nxt != (_Hash_node_base *)0x0) {
        (*(code *)(p_Var1[1]._M_nxt)->_M_nxt[1]._M_nxt)();
      }
      operator_delete(p_Var1);
    }
  }
  if (this->game != (IBoard *)0x0) {
    operator_delete(this->game);
  }
  std::
  _Hashtable<long_long,_std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_std::allocator<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->bots)._M_h);
  return;
}

Assistant:

Manager<IGame>::~Manager()
{
    for (auto it : bots)
        delete it.second;
    delete game;
}